

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_Ntk4DumpWeights(char *pFileNameIn,Vec_Ptr_t *vObjNames,char *pFileName)

{
  Acb_ObjType_t AVar1;
  int iVar2;
  Vec_Int_t *vObjs;
  Acb_Ntk_t *p;
  char *__s2;
  char *__s1;
  int i;
  int i_00;
  
  vObjs = Vec_IntAlloc(vObjNames->nSize);
  p = Acb_VerilogSimpleRead(pFileNameIn,(char *)0x0);
  Acb_NtkCreateFanout(p);
  for (i = 0; i < vObjNames->nSize; i = i + 1) {
    __s2 = (char *)Vec_PtrEntry(vObjNames,i);
    for (i_00 = 1; i_00 < (p->vObjType).nSize; i_00 = i_00 + 1) {
      AVar1 = Acb_ObjType(p,i_00);
      if (AVar1 != ABC_OPER_NONE) {
        __s1 = Acb_ObjNameStr(p,i_00);
        iVar2 = strcmp(__s1,__s2);
        if (iVar2 == 0) {
          Vec_IntPush(vObjs,i_00);
        }
      }
    }
  }
  Acb_Ntk4DumpWeightsInt(p,vObjs,pFileName);
  Acb_ManFree(p->pDesign);
  Vec_IntFree(vObjs);
  return;
}

Assistant:

void Acb_Ntk4DumpWeights( char * pFileNameIn, Vec_Ptr_t * vObjNames, char * pFileName )
{
    char * pName; int i, iObj;
    Vec_Int_t * vObjs = Vec_IntAlloc( Vec_PtrSize(vObjNames) );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNameIn, NULL );
    Acb_NtkCreateFanout( pNtkF );
    Vec_PtrForEachEntry( char *, vObjNames, pName, i )
    {
        Acb_NtkForEachObj( pNtkF, iObj )
            if ( !strcmp(Acb_ObjNameStr(pNtkF, iObj), pName) )
                Vec_IntPush( vObjs, iObj );
    }
    Acb_Ntk4DumpWeightsInt( pNtkF, vObjs, pFileName );
    Acb_ManFree( pNtkF->pDesign );
    Vec_IntFree( vObjs );
}